

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::OP_InvalidateCachedScope(void *varEnv,int32 envIndex)

{
  code *pcVar1;
  bool bVar2;
  void *aValue;
  undefined4 *puVar3;
  RecyclableObject *pRVar4;
  RecyclableObject *objScope;
  Var item;
  FrameDisplay *disp;
  int32 envIndex_local;
  void *varEnv_local;
  
  aValue = FrameDisplay::GetItem((FrameDisplay *)varEnv,envIndex);
  if (aValue != (void *)0x0) {
    bVar2 = VarIs<Js::ActivationObjectEx>(aValue);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x17ac,"(VarIs<ActivationObjectEx>(item))",
                                  "VarIs<ActivationObjectEx>(item)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    pRVar4 = VarTo<Js::RecyclableObject>(aValue);
    (*(pRVar4->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x59])();
  }
  return;
}

Assistant:

void JavascriptOperators::OP_InvalidateCachedScope(void* varEnv, int32 envIndex)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(OP_InvalidateCachedScope);
        FrameDisplay *disp = (FrameDisplay*)varEnv;
        Var item = disp->GetItem(envIndex);
        if (item != nullptr)
        {
            Assert(VarIs<ActivationObjectEx>(item));
            RecyclableObject *objScope = VarTo<RecyclableObject>(item);
            objScope->InvalidateCachedScope();
        }
        JIT_HELPER_END(OP_InvalidateCachedScope);
    }